

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# appender.cpp
# Opt level: O3

void __thiscall
duckdb::BaseAppender::AppendValueInternal<unsigned_long,signed_char>
          (BaseAppender *this,Vector *col,unsigned_long input)

{
  bool bVar1;
  undefined1 auVar2 [16];
  char result;
  data_t local_41;
  string local_40;
  
  bVar1 = TryCast::Operation<unsigned_long,signed_char>(input,(int8_t *)&local_41,false);
  if (bVar1) {
    col->data[(this->chunk).count] = local_41;
    return;
  }
  auVar2 = __cxa_allocate_exception(0x10);
  CastExceptionText<unsigned_long,signed_char>(&local_40,(duckdb *)input,auVar2._8_8_);
  InvalidInputException::InvalidInputException(auVar2._0_8_,&local_40);
  __cxa_throw(auVar2._0_8_,&InvalidInputException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

void BaseAppender::AppendValueInternal(Vector &col, SRC input) {
	FlatVector::GetData<DST>(col)[chunk.size()] = Cast::Operation<SRC, DST>(input);
}